

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory_Banks.c
# Opt level: O1

uint8_t gb_read_mbc_5(MemoryBankController *mc,uint16_t address)

{
  uint8_t uVar1;
  uint uVar2;
  undefined6 in_register_00000032;
  
  uVar2 = (uint)CONCAT62(in_register_00000032,address);
  if (uVar2 < 0x4000) {
    return mc->rom[address];
  }
  if (-1 < (short)address) {
    return mc->rom[(ulong)(((uint)mc->banking_register_1 & mc->rom_bank_mask) << 0xe) +
                   (ulong)(uVar2 - 0x4000)];
  }
  if ((uVar2 & 0xe000) == 0xa000) {
    uVar1 = 0xff;
    if (mc->ram_enabled == true) {
      uVar1 = mc->ram[((uint)mc->banking_register_2 & mc->ram_bank_mask) << 0xd | uVar2 - 0xa000];
    }
    return uVar1;
  }
  uVar1 = gb_common_reads(mc,address);
  return uVar1;
}

Assistant:

uint8_t gb_read_mbc_5(MemoryBankController* mc, uint16_t address) {

    //Always contains the first 16kbs of rom for MBC 5
    if (address <= 0x3FFF) {
        return mc->rom[address];
    }

    //Can contain banks up to 0x1FF, including bank 0
    if(address >= 0x4000 && address <= 0x7FFF) {
        int offset = address - ROM_BANK_SIZE;
        int read_addr = offset + (mc->banking_register_1 & mc->rom_bank_mask) * ROM_BANK_SIZE;
        return mc->rom[read_addr];
    }
    
    //Same as for MBC1, but can contain more ram
    if (address >= 0xA000 && address <= 0xBFFF) {
        if (mc->ram_enabled) {
            int offset = address - 0xA000;
            int ram_bank = mc->banking_register_2;
            int read_addr = offset + (ram_bank & mc->ram_bank_mask) * RAM_BANK_SIZE;
            return mc->ram[read_addr];
        }
        return 0xFF;
    }

    return gb_common_reads(mc, address);
}